

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  u8 **ppuVar1;
  ushort uVar2;
  Fts5Config *pFVar3;
  sqlite3_blob *pBlob;
  Fts5SegIter *pFVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  u8 *pTerm;
  byte bVar8;
  int iVar9;
  undefined8 *p_00;
  Fts5Structure *pFVar10;
  undefined8 *puVar11;
  Fts5Iter *pFVar12;
  code *pcVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  int *pRc;
  undefined8 *puVar17;
  long lVar18;
  bool bVar19;
  Fts5Iter *pRet;
  Fts5SegIter *local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  int local_a4;
  u8 *local_a0;
  Fts5Config *local_98;
  int *local_90;
  Fts5Buffer buf;
  long local_78;
  Fts5SegIter *pSeg;
  undefined8 uStack_40;
  Fts5Iter *p1;
  
  pFVar3 = p->pConfig;
  pRet = (Fts5Iter *)0x0;
  buf.p = (u8 *)0x0;
  buf.n = 0;
  buf.nSpace = 0;
  pRc = &p->rc;
  local_a8 = flags;
  iVar9 = sqlite3Fts5BufferSize(pRc,&buf,nToken + 1U);
  if (iVar9 == 0) {
    local_a0 = (u8 *)CONCAT44(local_a0._4_4_,nToken + 1U);
    local_98 = pFVar3;
    local_90 = pRc;
    if (nToken != 0) {
      memcpy(buf.p + 1,pToken,(long)nToken);
    }
    pTerm = buf.p;
    pRc = local_90;
    uVar7 = local_a8;
    uVar16 = 0;
    if ((local_a8 & 1) != 0) {
      if (nToken < 1) {
        iVar9 = 0;
      }
      else {
        iVar14 = 0;
        iVar9 = 0;
        do {
          iVar14 = iVar14 + 1;
          iVar9 = iVar9 + 1;
        } while (iVar14 < nToken);
      }
      if (local_98->nPrefix < 1) {
        uVar16 = 1;
      }
      else {
        uVar16 = (ulong)(uint)local_98->nPrefix + 1;
        uVar15 = 1;
        do {
          if (local_98->aPrefix[uVar15 - 1] == iVar9) {
            uVar16 = uVar15 & 0xffffffff;
            break;
          }
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
    }
    if (local_98->nPrefix < (int)uVar16) {
      *buf.p = '0';
      bVar19 = p->pConfig->eDetail == 1;
      pcVar13 = fts5AppendPoslist;
      if (bVar19) {
        pcVar13 = fts5AppendRowid;
      }
      local_98 = (Fts5Config *)fts5MergePrefixLists;
      if (bVar19) {
        local_98 = (Fts5Config *)fts5MergeRowidLists;
      }
      p_00 = (undefined8 *)sqlite3Fts5MallocZero(local_90,0x200);
      pFVar10 = fts5StructureRead(p);
      if (pFVar10 != (Fts5Structure *)0x0 && p_00 != (undefined8 *)0x0) {
        p1 = (Fts5Iter *)0x0;
        local_b8 = (Fts5SegIter *)0x0;
        uStack_b0 = 0;
        iVar9 = (int)local_a0;
        fts5MultiIterNew(p,pFVar10,0x38,pColset,pTerm,(int)local_a0,-1,0,&p1);
        pFVar12 = p1;
        fts5IterSetOutputCb(pRc,p1);
        if (p->rc == 0) {
          bVar19 = true;
          local_78 = 0;
          do {
            if ((pFVar12->base).bEof != '\0') break;
            uVar2 = pFVar12->aFirst[1].iFirst;
            iVar14 = pFVar12->aSeg[uVar2].term.n;
            local_a0 = pFVar12->aSeg[uVar2].term.p;
            (*pFVar12->xSetOutputs)(pFVar12,pFVar12->aSeg + uVar2);
            if (bVar19) {
              bVar6 = true;
              if (nToken < iVar14) {
                iVar14 = bcmp(pTerm,local_a0,(long)iVar9);
                if (iVar14 == 0) goto LAB_001a32b3;
                bVar6 = true;
              }
            }
            else {
LAB_001a32b3:
              if ((pFVar12->base).nData != 0) {
                if (((pFVar12->base).iRowid <= local_78) && (0 < (int)uStack_b0)) {
                  puVar11 = p_00;
                  if (*pRc == 0) {
                    do {
                      if (*(int *)(puVar11 + 1) == 0) {
                        pSeg = local_b8;
                        uStack_40 = uStack_b0;
                        pFVar4 = (Fts5SegIter *)*puVar11;
                        uVar5 = puVar11[1];
                        *puVar11 = local_b8;
                        puVar11[1] = uStack_b0;
                        puVar17 = &uStack_b0;
                        local_b8 = pFVar4;
                        uStack_b0 = uVar5;
                      }
                      else {
                        puVar17 = puVar11 + 1;
                        (*(code *)local_98)(p,&local_b8,puVar11);
                      }
                      *(undefined4 *)puVar17 = 0;
                      pRc = local_90;
                      if (*local_90 != 0) goto LAB_001a32d4;
                      local_78 = 0;
                      puVar11 = puVar11 + 2;
                    } while ((int)uStack_b0 != 0);
                  }
                  else {
LAB_001a32d4:
                    local_78 = 0;
                  }
                }
                (*pcVar13)(p,(pFVar12->base).iRowid - local_78,pFVar12,&local_b8);
                local_78 = (pFVar12->base).iRowid;
              }
              bVar6 = false;
            }
            if (bVar6) break;
            if (*pRc == 0) {
              bVar19 = false;
              do {
                uVar2 = pFVar12->aFirst[1].iFirst;
                pSeg = pFVar12->aSeg + uVar2;
                local_a4 = 0;
                (*pFVar12->aSeg[uVar2].xNext)(p,pSeg,&local_a4);
                if (((pFVar12->aSeg[uVar2].pLeaf == (Fts5Data *)0x0) || (local_a4 != 0)) ||
                   (iVar14 = fts5MultiIterAdvanceRowid(pFVar12,(uint)uVar2,&pSeg), iVar14 != 0)) {
                  bVar19 = true;
                  fts5MultiIterAdvanced(p,pFVar12,(uint)uVar2,1);
                  uVar2 = pFVar12->aFirst[1].iFirst;
                  (pFVar12->base).bEof = pFVar12->aSeg[uVar2].pLeaf == (Fts5Data *)0x0;
                  pFVar12->iSwitchRowid = pFVar12->aSeg[uVar2].iRowid;
                }
                pRc = local_90;
              } while (((*local_90 == 0) &&
                       (uVar2 = pFVar12->aFirst[1].iFirst,
                       pFVar12->aSeg[uVar2].pLeaf != (Fts5Data *)0x0)) &&
                      (pFVar12->aSeg[uVar2].nPos == 0));
            }
          } while (*pRc == 0);
        }
        lVar18 = 0;
        do {
          if (*pRc == 0) {
            (*(code *)local_98)(p,&local_b8,(long)p_00 + lVar18);
          }
          sqlite3_free(*(void **)((long)p_00 + lVar18));
          *(undefined8 *)((long)p_00 + lVar18) = 0;
          ((undefined8 *)((long)p_00 + lVar18))[1] = 0;
          lVar18 = lVar18 + 0x10;
        } while (lVar18 != 0x200);
        fts5MultiIterFree(pFVar12);
        puVar11 = (undefined8 *)sqlite3Fts5MallocZero(pRc,(long)(int)uStack_b0 + 0x18);
        if (puVar11 != (undefined8 *)0x0) {
          *puVar11 = puVar11 + 2;
          *(int *)((long)puVar11 + 0xc) = (int)uStack_b0;
          *(int *)(puVar11 + 1) = (int)uStack_b0;
          if ((long)(int)uStack_b0 != 0) {
            memcpy(puVar11 + 2,local_b8,(long)(int)uStack_b0);
          }
          pFVar12 = fts5MultiIterAlloc(p,2);
          if (pFVar12 != (Fts5Iter *)0x0) {
            *(undefined4 *)&pFVar12[1].base.pData = 1;
            if (*(int *)((long)puVar11 + 0xc) < 1) {
              (pFVar12->base).bEof = '\x01';
            }
            else {
              *(undefined8 **)&pFVar12[1].base.nData = puVar11;
              bVar8 = sqlite3Fts5GetVarint((uchar *)*puVar11,(u64 *)&pFVar12[1].aSeg[0].flags);
              *(uint *)&pFVar12[1].poslist.p = (uint)bVar8;
              *(undefined4 *)((long)&pFVar12[1].xSetOutputs + 4) = *(undefined4 *)(puVar11 + 1);
              pFVar12->aFirst[1].iFirst = 1;
              if ((local_a8 & 2) == 0) {
                fts5SegIterLoadNPos(p,(Fts5SegIter *)(pFVar12 + 1));
              }
              else {
                pFVar12->bRev = 1;
                ppuVar1 = &pFVar12[1].base.pData;
                *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
                fts5SegIterReverseInitPage(p,(Fts5SegIter *)(pFVar12 + 1));
              }
              puVar11 = (undefined8 *)0x0;
            }
            if (((ulong)pFVar12[1].base.pData & 2) == 0) {
              if (p->pConfig->eDetail == 1) {
                pcVar13 = fts5SegIterNext_None;
              }
              else {
                pcVar13 = fts5SegIterNext;
              }
            }
            else {
              pcVar13 = fts5SegIterNext_Reverse;
            }
            *(code **)&pFVar12[1].poslist.n = pcVar13;
            pRet = pFVar12;
          }
          sqlite3_free(puVar11);
        }
        sqlite3_free(local_b8);
      }
      fts5StructureRelease(pFVar10);
      sqlite3_free(p_00);
      pFVar12 = pRet;
      fts5IterSetOutputCb(pRc,pRet);
      if ((*pRc == 0) &&
         (uVar2 = pFVar12->aFirst[1].iFirst, pFVar12->aSeg[uVar2].pLeaf != (Fts5Data *)0x0)) {
        (*pFVar12->xSetOutputs)(pFVar12,pFVar12->aSeg + uVar2);
      }
    }
    else {
      pFVar10 = fts5StructureRead(p);
      *buf.p = (char)uVar16 + '0';
      if (pFVar10 != (Fts5Structure *)0x0) {
        fts5MultiIterNew(p,pFVar10,uVar7 | 0x10,pColset,buf.p,(int)local_a0,-1,0,&pRet);
        fts5StructureRelease(pFVar10);
      }
    }
    if (*pRc != 0) {
      sqlite3Fts5IterClose(&pRet->base);
      pRet = (Fts5Iter *)0x0;
      pBlob = p->pReader;
      if (pBlob != (sqlite3_blob *)0x0) {
        p->pReader = (sqlite3_blob *)0x0;
        sqlite3_blob_close(pBlob);
      }
    }
    *ppIter = &pRet->base;
    sqlite3_free(buf.p);
  }
  iVar9 = *pRc;
  *pRc = 0;
  return iVar9;
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    if( nToken ) memcpy(&buf.p[1], pToken, nToken);

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists), 
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug 
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        if( pConfig->aPrefix[iIdx-1]==nChar ) break;
      }
    }

    if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY, 
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      buf.p[0] = FTS5_MAIN_PREFIX;
      fts5SetupPrefixIter(p, bDesc, buf.p, nToken+1, pColset, &pRet);
      assert( p->rc!=SQLITE_OK || pRet->pColset==0 );
      fts5IterSetOutputCb(&p->rc, pRet);
      if( p->rc==SQLITE_OK ){
        Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
        if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
      }
    }

    if( p->rc ){
      sqlite3Fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5CloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}